

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O1

string_view __thiscall absl::cord_internal::CordRepBtreeReader::Next(CordRepBtreeReader *this)

{
  CordRepBtree *pCVar1;
  CordRep *pCVar2;
  size_t sVar3;
  byte bVar4;
  size_t sVar5;
  uint8_t *puVar6;
  CordRep *pCVar7;
  string_view sVar8;
  
  if (this->remaining_ == 0) {
    sVar3 = 0;
    puVar6 = (uint8_t *)0x0;
  }
  else {
    pCVar1 = (this->navigator_).node_[0];
    bVar4 = (this->navigator_).index_[0];
    if ((ulong)(pCVar1->super_CordRep).storage[2] - 1 == (ulong)bVar4) {
      pCVar2 = CordRepBtreeNavigator::NextUp(&this->navigator_);
    }
    else {
      bVar4 = bVar4 + 1;
      (this->navigator_).index_[0] = bVar4;
      if (bVar4 < (pCVar1->super_CordRep).storage[1]) {
        __assert_fail("index >= begin()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      if ((pCVar1->super_CordRep).storage[2] <= bVar4) {
        __assert_fail("index < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      pCVar2 = pCVar1->edges_[bVar4];
    }
    if (pCVar2 == (CordRep *)0x0) {
      __assert_fail("edge != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree_reader.h"
                    ,0xb1,"absl::string_view absl::cord_internal::CordRepBtreeReader::Next()");
    }
    sVar3 = pCVar2->length;
    this->remaining_ = this->remaining_ - sVar3;
    bVar4 = pCVar2->tag;
    if (bVar4 < 5) {
      pCVar7 = pCVar2;
      if (bVar4 == 1) {
        pCVar7 = *(CordRep **)&pCVar2[1].refcount;
      }
      if (pCVar7->tag < 5) {
        __assert_fail("IsDataEdge(edge)",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_data_edge.h"
                      ,0x2e,"absl::string_view absl::cord_internal::EdgeData(const CordRep *)");
      }
    }
    if (bVar4 == 1) {
      sVar5 = pCVar2[1].length;
      pCVar2 = *(CordRep **)&pCVar2[1].refcount;
    }
    else {
      sVar5 = 0;
    }
    bVar4 = pCVar2->tag;
    if (bVar4 < 6) {
      if (bVar4 != 5) {
        __assert_fail("IsExternal()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                      ,0x388,"const CordRepExternal *absl::cord_internal::CordRep::external() const"
                     );
      }
      puVar6 = (uint8_t *)pCVar2[1].length;
    }
    else {
      if ((bVar4 - 0xf9 < 7) || (bVar4 < 6)) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
      }
      puVar6 = pCVar2->storage;
    }
    puVar6 = puVar6 + sVar5;
  }
  sVar8._M_str = (char *)puVar6;
  sVar8._M_len = sVar3;
  return sVar8;
}

Assistant:

inline absl::string_view CordRepBtreeReader::Next() {
  if (remaining_ == 0) return {};
  const CordRep* edge = navigator_.Next();
  assert(edge != nullptr);
  remaining_ -= edge->length;
  return EdgeData(edge);
}